

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       list_caster<std::vector<anurbs::Ref<anurbs::BrepEdge>,std::allocator<anurbs::Ref<anurbs::BrepEdge>>>,anurbs::Ref<anurbs::BrepEdge>>
       ::
       cast<std::vector<anurbs::Ref<anurbs::BrepEdge>,std::allocator<anurbs::Ref<anurbs::BrepEdge>>>>
                 (vector<anurbs::Ref<anurbs::BrepEdge>,_std::allocator<anurbs::Ref<anurbs::BrepEdge>_>_>
                  *src,return_value_policy policy,handle parent)

{
  pointer pRVar1;
  PyObject *tmp;
  handle hVar2;
  long lVar3;
  void *vsrc;
  pointer src_00;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar4;
  list l;
  object value_;
  handle local_40;
  object local_38;
  
  list::list((list *)&local_40,
             (long)(src->
                   super__Vector_base<anurbs::Ref<anurbs::BrepEdge>,_std::allocator<anurbs::Ref<anurbs::BrepEdge>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(src->
                   super__Vector_base<anurbs::Ref<anurbs::BrepEdge>,_std::allocator<anurbs::Ref<anurbs::BrepEdge>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  src_00 = (src->
           super__Vector_base<anurbs::Ref<anurbs::BrepEdge>,_std::allocator<anurbs::Ref<anurbs::BrepEdge>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (src->
           super__Vector_base<anurbs::Ref<anurbs::BrepEdge>,_std::allocator<anurbs::Ref<anurbs::BrepEdge>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (src_00 != pRVar1) {
    lVar3 = 0;
    do {
      pVar4 = type_caster_generic::src_and_type
                        (src_00,(type_info *)&anurbs::Ref<anurbs::BrepEdge>::typeinfo,
                         (type_info *)0x0);
      hVar2 = type_caster_generic::cast
                        (pVar4.first,move,parent,pVar4.second,
                         anon_func::anon_class_1_0_00000001::__invoke,
                         anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
      if (hVar2.m_ptr == (PyObject *)0x0) {
        local_38.super_handle = hVar2;
        object::~object(&local_38);
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_001e9528;
      }
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      if (((local_40.m_ptr)->ob_type->tp_flags & 0x2000000) == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<anurbs::Ref<anurbs::BrepEdge>>, anurbs::Ref<anurbs::BrepEdge>>::cast(T &&, return_value_policy, handle) [Type = std::vector<anurbs::Ref<anurbs::BrepEdge>>, Value = anurbs::Ref<anurbs::BrepEdge>, T = std::vector<anurbs::Ref<anurbs::BrepEdge>>]"
                     );
      }
      *(PyObject **)((long)&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar3) =
           hVar2.m_ptr;
      object::~object(&local_38);
      src_00 = src_00 + 1;
      lVar3 = lVar3 + 8;
    } while (src_00 != pRVar1);
  }
  hVar2.m_ptr = local_40.m_ptr;
  local_40.m_ptr = (PyObject *)0x0;
LAB_001e9528:
  object::~object((object *)&local_40);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }